

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaSimAreEqual(Gia_Man_t *p,int iObj0,int iObj1)

{
  int iVar1;
  word *pwVar2;
  word *pwVar3;
  word *pSim1;
  word *pSim0;
  int nWords;
  int w;
  int iObj1_local;
  int iObj0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjSimWords(p);
  pwVar2 = Gia_ObjSim(p,iObj0);
  pwVar3 = Gia_ObjSim(p,iObj1);
  if ((*pwVar2 & 1) == (*pwVar3 & 1)) {
    for (pSim0._4_4_ = 0; pSim0._4_4_ < iVar1; pSim0._4_4_ = pSim0._4_4_ + 1) {
      if (pwVar2[pSim0._4_4_] != pwVar3[pSim0._4_4_]) {
        return 0;
      }
    }
  }
  else {
    for (pSim0._4_4_ = 0; pSim0._4_4_ < iVar1; pSim0._4_4_ = pSim0._4_4_ + 1) {
      if (pwVar2[pSim0._4_4_] != (pwVar3[pSim0._4_4_] ^ 0xffffffffffffffff)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static inline int Ssc_GiaSimAreEqual( Gia_Man_t * p, int iObj0, int iObj1 )
{
    int w, nWords = Gia_ObjSimWords(p);
    word * pSim0 = Gia_ObjSim( p, iObj0 );
    word * pSim1 = Gia_ObjSim( p, iObj1 );
    if ( (pSim0[0] & 1) != (pSim1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( pSim0[w] != ~pSim1[w] )
                return 0;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( pSim0[w] != pSim1[w] )
                return 0;
    }
    return 1;
}